

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iexchange.hpp
# Opt level: O0

void __thiscall
diy::Master::IExchangeInfo::IExchangeInfo(IExchangeInfo *this,communicator *c,Profiler *p)

{
  undefined8 in_RDX;
  communicator *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__IExchangeInfo_001bec10;
  mpi::communicator::communicator((communicator *)(in_RDI + 1),in_RSI);
  get_logger();
  in_RDI[6] = in_RDX;
  return;
}

Assistant:

IExchangeInfo(mpi::communicator c, stats::Profiler& p):
                            comm(c),
                            prof(p)                             {}